

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::CellsAreSortedAfterCompacting(VectorRasterizerTests *this)

{
  long lVar1;
  undefined1 *puVar2;
  cell *pcVar3;
  byte bVar4;
  allocator local_129;
  string local_128;
  LocationInfo local_108;
  vector_rasterizer vr;
  cell reference [9];
  
  bVar4 = 0;
  vector_rasterizer::vector_rasterizer(&vr);
  anon_unknown_6::rectangle(&vr,2.0,1.0,5.0,5.0);
  vector_rasterizer::compact(&vr);
  puVar2 = &DAT_001aac60;
  pcVar3 = reference;
  for (lVar1 = 0x5a; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(undefined1 *)&pcVar3->x = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    pcVar3 = (cell *)((long)pcVar3 + (ulong)bVar4 * -2 + 1);
  }
  std::__cxx11::string::string
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_129);
  ut::LocationInfo::LocationInfo(&local_108,&local_128,0x5f7);
  ut::is_true(vr._sorted != 0,&local_108);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string
            ((string *)&local_128,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_129);
  ut::LocationInfo::LocationInfo(&local_108,&local_128,0x5f8);
  ut::are_equal<agge::vector_rasterizer::cell,9ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            (&reference,&vr._cells,&local_108);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&vr);
  return;
}

Assistant:

test( CellsAreSortedAfterCompacting )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				rectangle(vr, 2, 1, 5, 5);
				vr.compact();

				// ASSERT
				vector_rasterizer::cell reference[] = {
					{ 2, 1, 0, -256 }, { 5, 1, 0, 256 },
					{ 2, 2, 0, -256 }, { 5, 2, 0, 256 },
					{ 2, 3, 0, -256 }, { 5, 3, 0, 256 },
					{ 2, 4, 0, -256 }, { 5, 4, 0, 256 },
					{ 5, 5, 0, 0 },
				};

				assert_is_true(vr.sorted());
				assert_equal(reference, vr.cells());
			}